

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Creature.cpp
# Opt level: O0

void __thiscall Creature::make_sweet_sweet_love(Creature *this,Creature *mate,size_t xpnt)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  runtime_error *this_00;
  reference this_01;
  type this_02;
  iterator __first;
  reference matechrom;
  double dVar4;
  __normal_iterator<boost::shared_ptr<Chromosome>_*,_std::vector<boost::shared_ptr<Chromosome>,_std::allocator<boost::shared_ptr<Chromosome>_>_>_>
  local_40;
  __normal_iterator<boost::shared_ptr<Chromosome>_*,_std::vector<boost::shared_ptr<Chromosome>,_std::allocator<boost::shared_ptr<Chromosome>_>_>_>
  local_38;
  iterator it;
  size_t xpnt_local;
  Creature *mate_local;
  Creature *this_local;
  
  sVar2 = std::
          vector<boost::shared_ptr<Chromosome>,_std::allocator<boost::shared_ptr<Chromosome>_>_>::
          size(&this->chroms);
  sVar3 = std::
          vector<boost::shared_ptr<Chromosome>,_std::allocator<boost::shared_ptr<Chromosome>_>_>::
          size(&mate->chroms);
  if (sVar2 != sVar3) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Mate has wrong number of chromosomes! Sick!");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_38._M_current =
       (shared_ptr<Chromosome> *)
       std::vector<boost::shared_ptr<Chromosome>,_std::allocator<boost::shared_ptr<Chromosome>_>_>::
       begin(&this->chroms);
  while( true ) {
    local_40._M_current =
         (shared_ptr<Chromosome> *)
         std::vector<boost::shared_ptr<Chromosome>,_std::allocator<boost::shared_ptr<Chromosome>_>_>
         ::end(&this->chroms);
    bVar1 = __gnu_cxx::operator!=(&local_38,&local_40);
    if (!bVar1) break;
    this_01 = __gnu_cxx::
              __normal_iterator<boost::shared_ptr<Chromosome>_*,_std::vector<boost::shared_ptr<Chromosome>,_std::allocator<boost::shared_ptr<Chromosome>_>_>_>
              ::operator*(&local_38);
    this_02 = boost::shared_ptr<Chromosome>::operator->(this_01);
    __first = std::
              vector<boost::shared_ptr<Chromosome>,_std::allocator<boost::shared_ptr<Chromosome>_>_>
              ::begin(&this->chroms);
    sVar2 = std::
            distance<__gnu_cxx::__normal_iterator<boost::shared_ptr<Chromosome>*,std::vector<boost::shared_ptr<Chromosome>,std::allocator<boost::shared_ptr<Chromosome>>>>>
                      ((__normal_iterator<boost::shared_ptr<Chromosome>_*,_std::vector<boost::shared_ptr<Chromosome>,_std::allocator<boost::shared_ptr<Chromosome>_>_>_>
                        )__first._M_current,local_38);
    matechrom = std::
                vector<boost::shared_ptr<Chromosome>,_std::allocator<boost::shared_ptr<Chromosome>_>_>
                ::operator[](&mate->chroms,sVar2);
    Chromosome::crossover(this_02,matechrom,xpnt);
    __gnu_cxx::
    __normal_iterator<boost::shared_ptr<Chromosome>_*,_std::vector<boost::shared_ptr<Chromosome>,_std::allocator<boost::shared_ptr<Chromosome>_>_>_>
    ::operator++(&local_38);
  }
  dVar4 = make_fitness(this);
  this->fitness = dVar4;
  dVar4 = make_fitness(this);
  mate->fitness = dVar4;
  return;
}

Assistant:

void Creature::make_sweet_sweet_love( Creature & mate, size_t xpnt )
{
	if(chroms.size() != mate.chroms.size())
	{
		throw std::runtime_error("Mate has wrong number of chromosomes! Sick!");
	}

	for(chroms_t::iterator it = chroms.begin(); it != chroms.end(); ++it)
	{
		(*it)->crossover(mate.chroms[std::distance(chroms.begin(), it)], xpnt);
	}

	fitness = make_fitness();
	mate.fitness = make_fitness();
}